

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O1

Am_Value Am_Get_Input_From_Dialog
                   (Am_Value_List *prompt_texts,Am_String *initial_value,int x,int y,bool modal)

{
  bool bVar1;
  char *value;
  Am_Wrapper *pAVar2;
  Am_Object *this;
  undefined4 in_register_00000014;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  undefined3 in_register_00000081;
  bool in_R9B;
  Am_Value AVar3;
  Am_Object the_dialog;
  Am_Object text_widget;
  Am_Object local_80;
  Am_Value_List local_78;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value local_40;
  
  bVar1 = Am_String::Valid((Am_String *)CONCAT44(in_register_00000014,x));
  if (bVar1) {
    value = Am_String::operator_cast_to_char_((Am_String *)CONCAT44(in_register_00000014,x));
  }
  else {
    value = "";
  }
  local_80.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value_List::Empty(&cached_text_input_dialogs);
  if (bVar1) {
    Am_Object::Create((Am_Object *)&local_78,(char *)&Am_Text_Input_Dialog);
    Am_Object::operator=(&local_80,(Am_Object *)&local_78);
    Am_Object::~Am_Object((Am_Object *)&local_78);
  }
  else {
    Am_Value_List::Pop(&local_78,true);
    Am_Object::operator=(&local_80,(Am_Value *)&local_78);
    Am_Value::~Am_Value((Am_Value *)&local_78);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)initial_value);
  Am_Object::Set(&local_80,0xa2,pAVar2,0);
  Am_Object::Get_Object((Am_Object *)&local_78,(Am_Slot_Key)&local_80,0xc5);
  this = Am_Object::Set((Am_Object *)&local_78,0xca,do_stop_waiting_for_dialog.from_wrapper,0);
  Am_Object::Set(this,0xc9,do_abort_waiting_for_dialog.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&local_78);
  Am_Object::Set(&local_80,0x169,value,0);
  Am_Object::Am_Object(&local_48,&local_80);
  Am_Object::Add_Part(&Am_Screen,&local_48,true,0);
  Am_Object::~Am_Object(&local_48);
  set_dialog_position(&local_80,y,CONCAT31(in_register_00000081,modal));
  Am_Object::Get_Object(&local_50,(Am_Slot_Key)&local_80,0x1ec);
  Am_Object::Get_Object((Am_Object *)&local_78,(Am_Slot_Key)&local_50,0x1eb);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_58,(Am_Object *)&local_78);
  Am_Value::Am_Value(&local_40,value);
  Am_Start_Widget(&local_58,&local_40);
  Am_Value::~Am_Value(&local_40);
  Am_Object::~Am_Object(&local_58);
  *(undefined2 *)&prompt_texts->data = 0;
  prompt_texts->item = (Am_List_Item *)0x0;
  Am_Object::Am_Object(&local_60,&local_80);
  Am_Pop_Up_Window_And_Wait(&local_60,(Am_Value *)prompt_texts,in_R9B);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Am_Object(&local_68,&local_80);
  Am_Object::Remove_Part(&Am_Screen,&local_68);
  Am_Object::~Am_Object(&local_68);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
  Am_Value_List::Add(&cached_text_input_dialogs,pAVar2,Am_HEAD,true);
  Am_Object::~Am_Object((Am_Object *)&local_78);
  Am_Object::~Am_Object(&local_80);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = prompt_texts;
  return AVar3;
}

Assistant:

Am_Value
Am_Get_Input_From_Dialog(Am_Value_List prompt_texts,
                         Am_String initial_value /*= ""*/,
                         int x /*= Am_AT_CENTER_SCREEN */,
                         int y /* = Am_AT_CENTER_SCREEN */,
                         bool modal /*=false*/)
{
  const char *initial_string;
  if (initial_value.Valid())
    initial_string = initial_value;
  else
    initial_string = "";
  Am_Object the_dialog;
  if (cached_text_input_dialogs.Empty())
    the_dialog = Am_Text_Input_Dialog.Create();
  else {
    the_dialog = cached_text_input_dialogs.Pop();
  }
  the_dialog.Set(Am_ITEMS, prompt_texts);
  the_dialog.Get_Object(Am_COMMAND)
      .Set(Am_DO_METHOD, do_stop_waiting_for_dialog)
      .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog);
  the_dialog.Set(Am_VALUE, initial_string);
  Am_Screen.Add_Part(the_dialog);
  set_dialog_position(the_dialog, x, y);
  Am_Object text_widget =
      the_dialog.Get_Object(Am_DIALOG_GROUP).Get_Object(Am_TEXT_WIDGET);
  Am_Start_Widget(text_widget, initial_string);
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(the_dialog, v, modal);
  Am_Screen.Remove_Part(the_dialog);
  cached_text_input_dialogs.Push(the_dialog);
  return v;
}